

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpint.c
# Opt level: O1

char * mp_get_hex_internal(mp_int *x,uint8_t letter_offset)

{
  char *buf;
  byte bVar1;
  long lVar2;
  long lVar3;
  ulong uVar4;
  uint uVar5;
  
  lVar2 = x->nw * 0x10;
  buf = (char *)safemalloc(lVar2 + 1U,1,0);
  buf[lVar2] = '\0';
  if (lVar2 != 0) {
    bVar1 = 0;
    uVar4 = 0;
    lVar3 = lVar2;
    do {
      uVar5 = (uint)(x->w[uVar4 >> 4] >> (bVar1 & 0x3c)) & 0xf;
      buf[lVar3 + -1] = (-(char)(uVar5 + 6 >> 4) & letter_offset) + (char)uVar5 + '0';
      uVar4 = uVar4 + 1;
      bVar1 = bVar1 + 4;
      lVar3 = lVar3 + -1;
    } while (lVar3 != 0);
  }
  trim_leading_zeroes(buf,lVar2 + 1U,lVar2 - 1);
  return buf;
}

Assistant:

static char *mp_get_hex_internal(mp_int *x, uint8_t letter_offset)
{
    size_t nibbles = x->nw * BIGNUM_INT_BYTES * 2;
    size_t bufsize = nibbles + 1;
    char *outbuf = snewn(bufsize, char);
    outbuf[nibbles] = '\0';

    for (size_t nibble = 0; nibble < nibbles; nibble++) {
        size_t word_idx = nibble / (BIGNUM_INT_BYTES*2);
        size_t nibble_within_word = nibble % (BIGNUM_INT_BYTES*2);
        uint8_t digitval = 0xF & (x->w[word_idx] >> (nibble_within_word * 4));

        uint8_t mask = -((digitval + 6) >> 4);
        char digit = digitval + '0' + (letter_offset & mask);
        outbuf[nibbles-1 - nibble] = digit;
    }

    trim_leading_zeroes(outbuf, bufsize, nibbles - 1);
    return outbuf;
}